

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

lu_mem atomic(lua_State *L)

{
  ushort uVar1;
  global_State *g;
  GCObject *pGVar2;
  GCObject *pGVar3;
  lua_State *plVar4;
  UpVal *pUVar5;
  lu_mem lVar6;
  lu_mem lVar7;
  lu_mem lVar8;
  lu_mem lVar9;
  lu_mem lVar10;
  int iVar11;
  anon_union_16_2_5131162a_for_u *paVar12;
  lua_State **pplVar13;
  
  g = L->l_G;
  pGVar2 = g->grayagain;
  g->grayagain = (GCObject *)0x0;
  if ((g->ephemeron != (GCObject *)0x0) || (g->weak != (GCObject *)0x0)) {
    __assert_fail("g->ephemeron == ((void*)0) && g->weak == ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                  ,0x655,"lu_mem atomic(lua_State *)");
  }
  if ((g->mainthread->marked & 0x18) != 0) {
    __assert_fail("!(((g->mainthread)->marked) & (((1<<(3)) | (1<<(4)))))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                  ,0x656,"lu_mem atomic(lua_State *)");
  }
  g->gcstate = '\x02';
  if ((L->marked & 0x18) != 0) {
    if (9 < (L->tt & 0xe)) {
      __assert_fail("(((L)->tt) & 0x0F) < (9+1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x658,"lu_mem atomic(lua_State *)");
    }
    reallymarkobject(g,(GCObject *)L);
  }
  uVar1 = (g->l_registry).tt_;
  if ((short)uVar1 < 0) {
    pGVar3 = (g->l_registry).value_.gc;
    if ((uVar1 & 0x7f) == (ushort)pGVar3->tt) {
      if ((g->mainthread == (lua_State *)0x0) ||
         (((g->mainthread->l_G->currentwhite ^ 0x18) & pGVar3->marked) == 0)) {
        if ((pGVar3->marked & 0x18) != 0) {
          reallymarkobject(g,pGVar3);
        }
        goto LAB_00115f41;
      }
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                  ,0x65a,"lu_mem atomic(lua_State *)");
  }
LAB_00115f41:
  markmt(g);
  lVar6 = propagateall(g);
  pplVar13 = &g->twups;
  iVar11 = 0;
  do {
    while( true ) {
      plVar4 = *pplVar13;
      if (plVar4 == (lua_State *)0x0) {
        lVar7 = propagateall(g);
        g->gray = pGVar2;
        lVar8 = propagateall(g);
        convergeephemerons(g);
        clearbyvalues(g,g->weak,(GCObject *)0x0);
        clearbyvalues(g,g->allweak,(GCObject *)0x0);
        pGVar2 = g->weak;
        pGVar3 = g->allweak;
        separatetobefnz(g,0);
        lVar9 = markbeingfnz(g);
        lVar10 = propagateall(g);
        convergeephemerons(g);
        clearbykeys(g,g->ephemeron);
        clearbykeys(g,g->allweak);
        clearbyvalues(g,g->weak,pGVar2);
        clearbyvalues(g,g->allweak,pGVar3);
        luaS_clearcache(g);
        g->currentwhite = g->currentwhite ^ 0x18;
        if (g->gray == (GCObject *)0x0) {
          return lVar9 + lVar10 + lVar7 + lVar8 + lVar6 + (long)iVar11;
        }
        __assert_fail("g->gray == ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x675,"lu_mem atomic(lua_State *)");
      }
      iVar11 = iVar11 + 1;
      if (((plVar4->marked & 0x18) != 0) || (plVar4->openupval == (UpVal *)0x0)) break;
      pplVar13 = &plVar4->twups;
    }
    if (((plVar4->marked & 6) != 0) && (plVar4->openupval != (UpVal *)0x0)) {
      __assert_fail("!(((thread)->marked & 7) > 1) || thread->openupval == ((void*)0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x1cf,"int remarkupvals(global_State *)");
    }
    *pplVar13 = plVar4->twups;
    plVar4->twups = plVar4;
    paVar12 = (anon_union_16_2_5131162a_for_u *)&plVar4->openupval;
    while (pUVar5 = (paVar12->open).next, pUVar5 != (UpVal *)0x0) {
      if ((pUVar5->u).open.touched != 0) {
        uVar1 = pUVar5->v->tt_;
        if ((short)uVar1 < 0) {
          pGVar3 = (pUVar5->v->value_).gc;
          if ((uVar1 & 0x7f) != (ushort)pGVar3->tt) {
LAB_00116120:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                          ,0x1d5,"int remarkupvals(global_State *)");
          }
          if ((g->mainthread != (lua_State *)0x0) &&
             (((g->mainthread->l_G->currentwhite ^ 0x18) & pGVar3->marked) != 0)) goto LAB_00116120;
          if ((pGVar3->marked & 0x18) != 0) {
            reallymarkobject(g,pGVar3);
          }
        }
        (pUVar5->u).open.touched = 0;
      }
      iVar11 = iVar11 + 1;
      paVar12 = &pUVar5->u;
    }
  } while( true );
}

Assistant:

static lu_mem atomic (lua_State *L) {
  global_State *g = G(L);
  lu_mem work = 0;
  GCObject *origweak, *origall;
  GCObject *grayagain = g->grayagain;  /* save original list */
  g->grayagain = NULL;
  lua_assert(g->ephemeron == NULL && g->weak == NULL);
  lua_assert(!iswhite(g->mainthread));
  g->gcstate = GCSatomic;
  markobject(g, L);  /* mark running thread */
  /* registry and global metatables may be changed by API */
  markvalue(g, &g->l_registry);
  markmt(g);  /* mark global metatables */
  work += propagateall(g);  /* empties 'gray' list */
  /* remark occasional upvalues of (maybe) dead threads */
  work += remarkupvals(g);
  work += propagateall(g);  /* propagate changes */
  g->gray = grayagain;
  work += propagateall(g);  /* traverse 'grayagain' list */
  convergeephemerons(g);
  /* at this point, all strongly accessible objects are marked. */
  /* Clear values from weak tables, before checking finalizers */
  clearbyvalues(g, g->weak, NULL);
  clearbyvalues(g, g->allweak, NULL);
  origweak = g->weak; origall = g->allweak;
  separatetobefnz(g, 0);  /* separate objects to be finalized */
  work += markbeingfnz(g);  /* mark objects that will be finalized */
  work += propagateall(g);  /* remark, to propagate 'resurrection' */
  convergeephemerons(g);
  /* at this point, all resurrected objects are marked. */
  /* remove dead objects from weak tables */
  clearbykeys(g, g->ephemeron);  /* clear keys from all ephemeron tables */
  clearbykeys(g, g->allweak);  /* clear keys from all 'allweak' tables */
  /* clear values from resurrected weak tables */
  clearbyvalues(g, g->weak, origweak);
  clearbyvalues(g, g->allweak, origall);
  luaS_clearcache(g);
  g->currentwhite = cast_byte(otherwhite(g));  /* flip current white */
  lua_assert(g->gray == NULL);
  return work;  /* estimate of slots marked by 'atomic' */
}